

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

bool __thiscall cmCTestRunProcess::StartProcess(cmCTestRunProcess *this)

{
  double timeout;
  pointer pbVar1;
  int iVar2;
  string *cl;
  pointer pbVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  char **local_58;
  undefined8 uStack_50;
  long local_48;
  char *local_38;
  
  local_58 = (char **)0x0;
  uStack_50 = 0;
  local_48 = 0;
  pbVar3 = (this->CommandLineStrings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->CommandLineStrings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    do {
      local_38 = (pbVar3->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_58,&local_38);
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
  }
  local_38 = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_58,&local_38);
  cmsysProcess_SetCommand(this->Process,local_58);
  if ((this->WorkingDirectory)._M_string_length != 0) {
    cmsysProcess_SetWorkingDirectory(this->Process,(this->WorkingDirectory)._M_dataplus._M_p);
  }
  cmsysProcess_SetOption(this->Process,0,1);
  timeout = (this->TimeOut).__r;
  if (0.0 <= timeout) {
    cmsysProcess_SetTimeout(this->Process,timeout);
  }
  cmsysProcess_Execute(this->Process);
  iVar2 = cmsysProcess_GetState(this->Process);
  this->PipeState = iVar2;
  if (local_58 != (char **)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  return iVar2 - 3U < 2;
}

Assistant:

bool StartProcess()
  {
    std::vector<const char*> args;
    for (std::string const& cl : this->CommandLineStrings) {
      args.push_back(cl.c_str());
    }
    args.push_back(nullptr); // null terminate
    cmsysProcess_SetCommand(this->Process, args.data());
    if (!this->WorkingDirectory.empty()) {
      cmsysProcess_SetWorkingDirectory(this->Process,
                                       this->WorkingDirectory.c_str());
    }

    cmsysProcess_SetOption(this->Process, cmsysProcess_Option_HideWindow, 1);
    if (this->TimeOut >= cmDuration::zero()) {
      cmsysProcess_SetTimeout(this->Process, this->TimeOut.count());
    }
    cmsysProcess_Execute(this->Process);
    this->PipeState = cmsysProcess_GetState(this->Process);
    // if the process is running or exited return true
    return this->PipeState == cmsysProcess_State_Executing ||
      this->PipeState == cmsysProcess_State_Exited;
  }